

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O1

bool __thiscall DataSourceBase::check_file(DataSourceBase *this,string *fpath)

{
  int iVar1;
  stat info;
  stat sStack_98;
  
  iVar1 = stat((fpath->_M_dataplus)._M_p,&sStack_98);
  return (sStack_98.st_mode & 0x4000) == 0 && iVar1 == 0;
}

Assistant:

void
SpriteBase::del(Data::PSprite other) {
  if ((width != other->get_width()) || (height != other->get_height())) {
    return;
  }

  uint32_t *src = reinterpret_cast<uint32_t*>(other->get_data());
  uint32_t *res = reinterpret_cast<uint32_t*>(data);

  for (unsigned int i = 0; i < width * height; i++) {
    if (*src++ == 0xFFFFFFFF) {
      *res = 0x00000000;
    }
    res++;
  }

  return;
}